

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

QCborValue * __thiscall
QJsonPrivate::Parser::parseValue(QCborValue *__return_storage_ptr__,Parser *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  long in_FS_OFFSET;
  StashedContainer local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = (byte *)this->json;
  pbVar1 = pbVar3 + 1;
  this->json = (char *)pbVar1;
  bVar2 = *pbVar3;
  if (bVar2 < 0x66) {
    if (bVar2 < 0x5b) {
      if (bVar2 == 0x22) {
        bVar4 = parseString(this);
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        if (bVar4) {
          __return_storage_ptr__->t = String;
          goto LAB_002f2e9d;
        }
LAB_002f2e0f:
        __return_storage_ptr__->t = Undefined;
        goto LAB_002f2e9d;
      }
      if (bVar2 == 0x2c) goto LAB_002f2e01;
    }
    else {
      if (bVar2 == 0x5b) {
        local_30.type = Array;
        local_30._4_4_ = 0xaaaaaaaa;
        local_30.stashed.d.ptr =
             (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->container).d.ptr;
        (this->container).d.ptr = (QCborContainerPrivate *)0x0;
        bVar4 = parseArray(this);
        if (bVar4) {
          StashedContainer::intoValue(__return_storage_ptr__,&local_30,&this->container);
        }
        else {
LAB_002f2e88:
          __return_storage_ptr__->n = 0;
          __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
          __return_storage_ptr__->t = Undefined;
        }
LAB_002f2e95:
        QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer
                  (&local_30.stashed);
        goto LAB_002f2e9d;
      }
      if (bVar2 == 0x5d) {
LAB_002f2c6c:
        this->lastError = MissingObject;
        goto LAB_002f2e09;
      }
    }
LAB_002f2e67:
    this->json = (char *)pbVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_002f2ee7;
    parseNumber(__return_storage_ptr__,this);
  }
  else {
    if (bVar2 < 0x74) {
      if (bVar2 == 0x66) {
        if (((((long)this->end - (long)pbVar1 < 4) ||
             (this->json = (char *)(pbVar3 + 2), pbVar3[1] != 0x61)) ||
            (this->json = (char *)(pbVar3 + 3), pbVar3[2] != 0x6c)) ||
           ((this->json = (char *)(pbVar3 + 4), pbVar3[3] != 0x73 ||
            (this->json = (char *)(pbVar3 + 5), pbVar3[4] != 0x65)))) {
LAB_002f2e01:
          this->lastError = IllegalValue;
LAB_002f2e09:
          __return_storage_ptr__->n = 0;
          __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
          goto LAB_002f2e0f;
        }
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = False;
      }
      else {
        if (bVar2 != 0x6e) goto LAB_002f2e67;
        if ((((long)this->end - (long)pbVar1 < 3) ||
            (this->json = (char *)(pbVar3 + 2), pbVar3[1] != 0x75)) ||
           ((this->json = (char *)(pbVar3 + 3), pbVar3[2] != 0x6c ||
            (this->json = (char *)(pbVar3 + 4), pbVar3[3] != 0x6c)))) goto LAB_002f2e01;
        __return_storage_ptr__->n = 0;
        __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
        __return_storage_ptr__->t = Null;
      }
    }
    else {
      if (bVar2 != 0x74) {
        if (bVar2 == 0x7b) {
          local_30.type = Map;
          local_30._4_4_ = 0xaaaaaaaa;
          local_30.stashed.d.ptr =
               (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->container).d.ptr;
          (this->container).d.ptr = (QCborContainerPrivate *)0x0;
          bVar4 = parseObject(this);
          if (!bVar4) goto LAB_002f2e88;
          StashedContainer::intoValue(__return_storage_ptr__,&local_30,&this->container);
          goto LAB_002f2e95;
        }
        if (bVar2 == 0x7d) goto LAB_002f2c6c;
        goto LAB_002f2e67;
      }
      if (((((long)this->end - (long)pbVar1 < 3) ||
           (this->json = (char *)(pbVar3 + 2), pbVar3[1] != 0x72)) ||
          (this->json = (char *)(pbVar3 + 3), pbVar3[2] != 0x75)) ||
         (this->json = (char *)(pbVar3 + 4), pbVar3[3] != 0x65)) goto LAB_002f2e01;
      __return_storage_ptr__->n = 0;
      __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
      __return_storage_ptr__->t = True;
    }
LAB_002f2e9d:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_002f2ee7:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QCborValue Parser::parseValue()
{
    switch (*json++) {
    case 'n':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'u' &&
            *json++ == 'l' &&
            *json++ == 'l') {
            return QCborValue(QCborValue::Null);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 't':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'r' &&
            *json++ == 'u' &&
            *json++ == 'e') {
            return QCborValue(true);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 'f':
        if (end - json < 4) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'a' &&
            *json++ == 'l' &&
            *json++ == 's' &&
            *json++ == 'e') {
            return QCborValue(false);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case Quote: {
        if (parseString())
            // strings are already added to the container
            // callers must check for this type
            return QCborValue(QCborValue::String);

        return QCborValue();
    }
    case BeginArray: {
        StashedContainer stashedContainer(&container, QCborValue::Array);
        if (parseArray())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case BeginObject: {
        StashedContainer stashedContainer(&container, QCborValue::Map);
        if (parseObject())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case ValueSeparator:
        // Essentially missing value, but after a colon, not after a comma
        // like the other MissingObject errors.
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case EndObject:
    case EndArray:
        lastError = QJsonParseError::MissingObject;
        return QCborValue();
    default:
        --json;
        return parseNumber();
    }
}